

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_loop_interp(jit_State *J,BCIns *pc,LoopEvent ev)

{
  int iVar1;
  TraceError e;
  long lVar2;
  long lVar3;
  
  if ((J->parent == 0) && (J->exitno == 0)) {
    if ((J->startpc == pc) && (J->framedepth + J->retdepth == 0)) {
      if ((char)(J->cur).startins == 'F') {
        return;
      }
      if (ev != LOOPEV_LEAVE) {
        lj_record_stop(J,LJ_TRLINK_LOOP,(uint)(J->cur).traceno);
        return;
      }
      e = LJ_TRERR_LLEAVE;
      goto LAB_0014c7e6;
    }
    if (ev == LOOPEV_LEAVE) {
      return;
    }
    if (*(short *)((long)pc + 2) != 0x7fff) {
      lVar2 = 0x718;
      do {
        lVar3 = lVar2;
        if (lVar3 + 0x10 == 0xb28) goto LAB_0014c7e0;
        lVar2 = lVar3 + 0x10;
      } while (*(BCIns **)(&(J->cur).marked + lVar3) != pc);
      if (((*(ushort *)((long)&(J->cur).unused_gc64 + lVar3 + 2) & 0xfffe) != 8) ||
         (*(ushort *)((long)&(J->cur).unused_gc64 + lVar3) < 0x90)) {
LAB_0014c7e0:
        e = LJ_TRERR_LINNER;
        goto LAB_0014c7e6;
      }
    }
    if ((((ev == LOOPEV_ENTERLO) || (J->loopref == 0)) || ((J->cur).nins - J->loopref < 0x19)) &&
       (iVar1 = J->loopunroll, J->loopunroll = iVar1 + -1, 0 < iVar1)) {
      J->loopref = (J->cur).nins;
      return;
    }
  }
  else {
    if (ev == LOOPEV_LEAVE) {
      return;
    }
    iVar1 = J->loopunroll;
    J->loopref = (J->cur).nins;
    J->loopunroll = iVar1 + -1;
    if (0 < iVar1) {
      return;
    }
  }
  e = LJ_TRERR_LUNROLL;
LAB_0014c7e6:
  lj_trace_err(J,e);
}

Assistant:

static void rec_loop_interp(jit_State *J, const BCIns *pc, LoopEvent ev)
{
  if (J->parent == 0 && J->exitno == 0) {
    if (pc == J->startpc && J->framedepth + J->retdepth == 0) {
      if (bc_op(J->cur.startins) == BC_ITERN) return;  /* See rec_itern(). */
      /* Same loop? */
      if (ev == LOOPEV_LEAVE)  /* Must loop back to form a root trace. */
	lj_trace_err(J, LJ_TRERR_LLEAVE);
      lj_record_stop(J, LJ_TRLINK_LOOP, J->cur.traceno);  /* Looping trace. */
    } else if (ev != LOOPEV_LEAVE) {  /* Entering inner loop? */
      /* It's usually better to abort here and wait until the inner loop
      ** is traced. But if the inner loop repeatedly didn't loop back,
      ** this indicates a low trip count. In this case try unrolling
      ** an inner loop even in a root trace. But it's better to be a bit
      ** more conservative here and only do it for very short loops.
      */
      if (bc_j(*pc) != -1 && !innerloopleft(J, pc))
	lj_trace_err(J, LJ_TRERR_LINNER);  /* Root trace hit an inner loop. */
      if ((ev != LOOPEV_ENTERLO &&
	   J->loopref && J->cur.nins - J->loopref > 24) || --J->loopunroll < 0)
	lj_trace_err(J, LJ_TRERR_LUNROLL);  /* Limit loop unrolling. */
      J->loopref = J->cur.nins;
    }
  } else if (ev != LOOPEV_LEAVE) {  /* Side trace enters an inner loop. */
    J->loopref = J->cur.nins;
    if (--J->loopunroll < 0)
      lj_trace_err(J, LJ_TRERR_LUNROLL);  /* Limit loop unrolling. */
  }  /* Side trace continues across a loop that's left or not entered. */
}